

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O2

DBErrors __thiscall wallet::WalletBatch::LoadWallet(WalletBatch *this,CWallet *pwallet)

{
  _Head_base<0UL,_wallet::DatabaseBatch_*,_false> _Var1;
  pointer puVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  DBErrors DVar6;
  LoadResult LVar7;
  LegacyDataSPKM *this_00;
  _Base_ptr p_Var8;
  LoadResult LVar9;
  LegacyScriptPubKeyMan *this_01;
  LoadResult LVar10;
  LoadResult LVar11;
  LoadResult LVar12;
  mapped_type *wtx;
  uint256 *hash;
  pointer __k;
  long *plVar13;
  long lVar14;
  DBErrors DVar15;
  DBErrors DVar16;
  long in_FS_OFFSET;
  DatabaseBatch *pDStack_290;
  int last_client;
  vector<uint256,_std::allocator<uint256>_> upgraded_txs;
  bool any_unordered;
  _Any_data local_238;
  code *local_228;
  code *local_220;
  _Any_data local_218;
  code *local_208;
  code *local_200;
  _Any_data local_1f8;
  code *local_1e8;
  code *local_1e0;
  _Any_data local_1d8;
  code *local_1c8;
  code *local_1c0;
  _Any_data local_1b8;
  code *local_1a8;
  code *local_1a0;
  _Any_data local_190;
  code *local_180;
  code *local_178;
  LoadResult keymeta_res;
  _Any_data local_168;
  code *local_158;
  code *local_150;
  _Any_data local_148;
  code *local_138;
  code *local_130;
  int num_ckeys;
  undefined4 uStack_124;
  undefined8 uStack_120;
  code *local_118;
  code *local_110;
  int num_keys;
  undefined4 uStack_104;
  undefined8 uStack_100;
  code *local_f8;
  code *local_f0;
  LoadResult ckey_res;
  LoadResult key_res;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock6;
  int nMinVersion;
  undefined4 uStack_a4;
  undefined1 auStack_a0 [24];
  _Base_ptr local_88;
  size_t local_80;
  LoadResult desc_res;
  undefined1 auStack_60 [8];
  _Manager_type local_58;
  _Invoker_type p_Stack_50;
  _Invoker_type local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  any_unordered = false;
  upgraded_txs.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  upgraded_txs.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  upgraded_txs.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock6,&pwallet->cs_wallet,"pwallet->cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp"
             ,0x48e,false);
  last_client = 0x46c6c;
  bVar3 = DatabaseBatch::Read<std::__cxx11::string,int>
                    ((this->m_batch)._M_t.
                     super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                     .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     DBKeys::VERSION_abi_cxx11_,&last_client);
  nMinVersion = CWallet::GetVersion(pwallet);
  CWallet::WalletLogPrintf<int,int>
            (pwallet,(ConstevalFormatString<2U>)0x3f0f62,&nMinVersion,&last_client);
  _nMinVersion = (ulong)(uint)uStack_a4 << 0x20;
  bVar4 = DatabaseBatch::Read<std::__cxx11::string,int>
                    ((this->m_batch)._M_t.
                     super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                     .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     DBKeys::MINVERSION_abi_cxx11_,&nMinVersion);
  if (bVar4) {
    if (nMinVersion < 0x297ad) {
      pwallet->nWalletVersion = nMinVersion;
      goto LAB_00198c5b;
    }
  }
  else {
LAB_00198c5b:
    bVar4 = DatabaseBatch::Read<std::__cxx11::string,unsigned_long>
                      ((this->m_batch)._M_t.
                       super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                       .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       DBKeys::FLAGS_abi_cxx11_,(unsigned_long *)&nMinVersion);
    if ((!bVar4) || (bVar4 = CWallet::LoadWalletFlags(pwallet,_nMinVersion), bVar4)) {
      iVar5 = last_client;
      _Var1._M_head_impl =
           (this->m_batch)._M_t.
           super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
           .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
      bVar4 = CWallet::IsWalletFlagSet(pwallet,0x400000000);
      if (bVar4) {
        plVar13 = (long *)(DBKeys::LEGACY_TYPES_abi_cxx11_ + 0x10);
        pDStack_290 = _Var1._M_head_impl;
        do {
          plVar13 = (long *)*plVar13;
          if (plVar13 == (long *)0x0) {
            DVar6 = LOAD_OK;
            goto LAB_00199313;
          }
          auStack_a0._8_8_ = (_Base_ptr)0x0;
          auStack_a0._16_8_ = (_Base_ptr)0x0;
          _nMinVersion = (pointer)0x0;
          auStack_a0._0_8_ = (pointer)0x0;
          local_58 = (_Manager_type)0x0;
          p_Stack_50 = (_Invoker_type)0x0;
          desc_res.m_result = LOAD_OK;
          desc_res.m_records = 0;
          auStack_60 = (undefined1  [8])0x0;
          key_res.m_result = LOAD_OK;
          key_res.m_records = 0;
          Serialize<DataStream,char>
                    ((DataStream *)&key_res,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (plVar13 + 1));
          (*(_Var1._M_head_impl)->_vptr_DatabaseBatch[10])
                    (&ckey_res,_Var1._M_head_impl,key_res,-(long)key_res);
          if (ckey_res == (LoadResult)0x0) {
            CWallet::WalletLogPrintf<std::__cxx11::string>
                      (pwallet,(ConstevalFormatString<1U>)0x3f118c,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (plVar13 + 1));
            pDStack_290 = (DatabaseBatch *)0x9;
LAB_00198dc5:
            bVar4 = false;
          }
          else {
            iVar5 = (**(code **)(*(long *)ckey_res + 0x10))
                              (ckey_res,(_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                         *)&nMinVersion,&desc_res);
            bVar4 = true;
            if (iVar5 != 2) {
              CWallet::WalletLogPrintf<std::__cxx11::string>
                        (pwallet,(ConstevalFormatString<1U>)0x3f11bc,&pwallet->m_name);
              pDStack_290 = (DatabaseBatch *)0x8;
              goto LAB_00198dc5;
            }
          }
          DVar16 = (DBErrors)pDStack_290;
          if (ckey_res != (LoadResult)0x0) {
            (**(code **)(*(long *)ckey_res + 8))();
          }
          std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                    ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&key_res);
          std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                    ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&desc_res);
          std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                    ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&nMinVersion)
          ;
        } while (bVar4);
      }
      else {
        _num_keys = (void *)0x0;
        uStack_100 = 0;
        local_f0 = std::
                   _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:572:9)>
                   ::_M_invoke;
        local_f8 = std::
                   _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:572:9)>
                   ::_M_manager;
        LVar10 = LoadRecords(pwallet,_Var1._M_head_impl,(string *)DBKeys::HDCHAIN_abi_cxx11_,
                             (LoadFunc *)&num_keys);
        std::_Function_base::~_Function_base((_Function_base *)&num_keys);
        _num_ckeys = (void *)0x0;
        uStack_120 = 0;
        local_110 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:579:9)>
                    ::_M_invoke;
        local_118 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:579:9)>
                    ::_M_manager;
        LVar11 = LoadRecords(pwallet,_Var1._M_head_impl,(string *)DBKeys::KEY_abi_cxx11_,
                             (LoadFunc *)&num_ckeys);
        key_res = LVar11;
        std::_Function_base::~_Function_base((_Function_base *)&num_ckeys);
        local_148._M_unused._M_object = (void *)0x0;
        local_148._8_8_ = 0;
        local_130 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:586:9)>
                    ::_M_invoke;
        local_138 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:586:9)>
                    ::_M_manager;
        LVar12 = LoadRecords(pwallet,_Var1._M_head_impl,(string *)DBKeys::CRYPTED_KEY_abi_cxx11_,
                             (LoadFunc *)&local_148);
        ckey_res = LVar12;
        std::_Function_base::~_Function_base((_Function_base *)&local_148);
        local_168._M_unused._M_object = (void *)0x0;
        local_168._8_8_ = 0;
        local_150 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:593:9)>
                    ::_M_invoke;
        local_158 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:593:9)>
                    ::_M_manager;
        LVar7 = LoadRecords(pwallet,_Var1._M_head_impl,(string *)DBKeys::CSCRIPT_abi_cxx11_,
                            (LoadFunc *)&local_168);
        DVar16 = LVar11.m_result;
        if ((int)LVar11.m_result < (int)LVar10.m_result) {
          DVar16 = LVar10.m_result;
        }
        if ((int)DVar16 <= (int)LVar12.m_result) {
          DVar16 = LVar12.m_result;
        }
        std::_Function_base::~_Function_base((_Function_base *)&local_168);
        if ((int)DVar16 <= (int)LVar7.m_result) {
          DVar16 = LVar7.m_result;
        }
        DVar6 = LOAD_OK;
        if (0 < (int)DVar16) {
          DVar6 = DVar16;
        }
        if ((0 < LVar12.m_records) &&
           (((iVar5 == 50000 || (iVar5 == 40000)) && (DVar6 = NEED_REWRITE, 2 < (int)DVar16)))) {
          DVar6 = DVar16;
        }
        auStack_a0._0_8_ = (ulong)(uint)auStack_a0._4_4_ << 0x20;
        auStack_a0._8_8_ = (_Base_ptr)0x0;
        local_80 = 0;
        local_190._8_8_ = 0;
        local_190._M_unused._M_object = &nMinVersion;
        local_178 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:616:9)>
                    ::_M_invoke;
        local_180 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:616:9)>
                    ::_M_manager;
        auStack_a0._16_8_ = (_Base_ptr)auStack_a0;
        local_88 = (_Base_ptr)auStack_a0;
        LVar10 = LoadRecords(pwallet,_Var1._M_head_impl,(string *)DBKeys::KEYMETA_abi_cxx11_,
                             (LoadFunc *)&local_190);
        keymeta_res = LVar10;
        std::_Function_base::~_Function_base((_Function_base *)&local_190);
        DVar16 = LVar10.m_result;
        if ((int)LVar10.m_result < (int)DVar6) {
          DVar16 = DVar6;
        }
        if (local_80 != 0) {
          this_00 = CWallet::GetLegacyDataSPKM(pwallet);
          if (this_00 == (LegacyDataSPKM *)0x0) {
            CWallet::WalletLogPrintf<>(pwallet,(ConstevalFormatString<0U>)0x3f1246);
            DVar16 = CORRUPT;
          }
          else {
            for (p_Var8 = (_Base_ptr)auStack_a0._16_8_; p_Var8 != (_Base_ptr)auStack_a0;
                p_Var8 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var8)) {
              bVar4 = operator!=((base_blob<160U> *)(p_Var8 + 1),
                                 (base_blob<160U> *)&(this_00->m_hd_chain).seed_id);
              if (bVar4) {
                LegacyDataSPKM::AddInactiveHDChain(this_00,(CHDChain *)&p_Var8[1]._M_right);
              }
            }
          }
        }
        local_1b8._M_unused._M_object = (void *)0x0;
        local_1b8._8_8_ = 0;
        local_1a0 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:703:9)>
                    ::_M_invoke;
        local_1a8 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:703:9)>
                    ::_M_manager;
        LVar10 = LoadRecords(pwallet,_Var1._M_head_impl,(string *)DBKeys::WATCHS_abi_cxx11_,
                             (LoadFunc *)&local_1b8);
        std::_Function_base::~_Function_base((_Function_base *)&local_1b8);
        local_1d8._M_unused._M_object = (void *)0x0;
        local_1d8._8_8_ = 0;
        local_1c0 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:717:9)>
                    ::_M_invoke;
        local_1c8 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:717:9)>
                    ::_M_manager;
        LVar11 = LoadRecords(pwallet,_Var1._M_head_impl,(string *)DBKeys::WATCHMETA_abi_cxx11_,
                             (LoadFunc *)&local_1d8);
        std::_Function_base::~_Function_base((_Function_base *)&local_1d8);
        local_1f8._M_unused._M_object = (void *)0x0;
        local_1f8._8_8_ = 0;
        local_1e0 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:729:9)>
                    ::_M_invoke;
        local_1e8 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:729:9)>
                    ::_M_manager;
        LVar12 = LoadRecords(pwallet,_Var1._M_head_impl,(string *)DBKeys::POOL_abi_cxx11_,
                             (LoadFunc *)&local_1f8);
        std::_Function_base::~_Function_base((_Function_base *)&local_1f8);
        local_218._M_unused._M_object = (void *)0x0;
        local_218._8_8_ = 0;
        local_200 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:746:9)>
                    ::_M_invoke;
        local_208 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:746:9)>
                    ::_M_manager;
        LVar7 = LoadRecords(pwallet,_Var1._M_head_impl,(string *)DBKeys::DEFAULTKEY_abi_cxx11_,
                            (LoadFunc *)&local_218);
        std::_Function_base::~_Function_base((_Function_base *)&local_218);
        local_238._M_unused._M_object = (void *)0x0;
        local_238._8_8_ = 0;
        local_220 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:764:9)>
                    ::_M_invoke;
        local_228 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:764:9)>
                    ::_M_manager;
        LVar9 = LoadRecords(pwallet,_Var1._M_head_impl,(string *)DBKeys::OLD_KEY_abi_cxx11_,
                            (LoadFunc *)&local_238);
        if ((int)DVar16 <= (int)LVar10.m_result) {
          DVar16 = LVar10.m_result;
        }
        if ((int)DVar16 <= (int)LVar11.m_result) {
          DVar16 = LVar11.m_result;
        }
        if ((int)DVar16 <= (int)LVar12.m_result) {
          DVar16 = LVar12.m_result;
        }
        if ((int)DVar16 <= (int)LVar7.m_result) {
          DVar16 = LVar7.m_result;
        }
        std::_Function_base::~_Function_base((_Function_base *)&local_238);
        if ((int)DVar16 <= (int)LVar9.m_result) {
          DVar16 = LVar9.m_result;
        }
        if ((int)DVar16 < 5) {
          desc_res.m_result = ckey_res.m_records + key_res.m_records;
          CWallet::WalletLogPrintf<int,int,int,int>
                    (pwallet,(ConstevalFormatString<4U>)0x3f127e,&key_res.m_records,
                     &ckey_res.m_records,&keymeta_res.m_records,(int *)&desc_res);
          bVar4 = CWallet::IsLegacy(pwallet);
          if (bVar4) {
            if ((LVar10.m_records + key_res.m_records + ckey_res.m_records !=
                 LVar11.m_records + keymeta_res.m_records) &&
               (this_01 = CWallet::GetLegacyScriptPubKeyMan(pwallet),
               this_01 != (LegacyScriptPubKeyMan *)0x0)) {
              UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                        ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&desc_res,
                         &(this_01->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore,
                         "spk_man->cs_KeyStore",
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp"
                         ,0x30b,false);
              LegacyScriptPubKeyMan::UpdateTimeFirstKey(this_01,1);
              std::unique_lock<std::recursive_mutex>::~unique_lock
                        ((unique_lock<std::recursive_mutex> *)&desc_res);
            }
          }
        }
        std::
        _Rb_tree<uint160,_std::pair<const_uint160,_wallet::CHDChain>,_std::_Select1st<std::pair<const_uint160,_wallet::CHDChain>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_wallet::CHDChain>_>_>
        ::~_Rb_tree((_Rb_tree<uint160,_std::pair<const_uint160,_wallet::CHDChain>,_std::_Select1st<std::pair<const_uint160,_wallet::CHDChain>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_wallet::CHDChain>_>_>
                     *)&nMinVersion);
      }
      DVar6 = LOAD_OK;
      if (0 < (int)DVar16) {
        DVar6 = DVar16;
      }
LAB_00199313:
      _Var1._M_head_impl =
           (this->m_batch)._M_t.
           super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
           .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
      _num_keys = (ulong)(uint)uStack_104 << 0x20;
      _num_ckeys = (ulong)(uint)uStack_124 << 0x20;
      key_res.m_result = last_client;
      _nMinVersion = (pointer)0x0;
      auStack_a0._0_8_ = (pointer)0x0;
      auStack_a0._8_8_ = (_Base_ptr)0x0;
      auStack_a0._16_8_ = (_Base_ptr)0x0;
      _nMinVersion = operator_new(0x20);
      *(DatabaseBatch **)_nMinVersion = _Var1._M_head_impl;
      *(int **)(_nMinVersion + 8) = &num_keys;
      *(int **)(_nMinVersion + 0x10) = &num_ckeys;
      *(LoadResult **)(_nMinVersion + 0x18) = &key_res;
      auStack_a0._16_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:804:9)>
           ::_M_invoke;
      auStack_a0._8_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:804:9)>
           ::_M_manager;
      desc_res = LoadRecords(pwallet,_Var1._M_head_impl,
                             (string *)DBKeys::WALLETDESCRIPTOR_abi_cxx11_,(LoadFunc *)&nMinVersion)
      ;
      DVar16 = desc_res.m_result;
      std::_Function_base::~_Function_base((_Function_base *)&nMinVersion);
      if ((int)DVar16 < 5) {
        local_148._0_4_ = num_ckeys + num_keys;
        CWallet::WalletLogPrintf<int,int,int,int>
                  (pwallet,(ConstevalFormatString<4U>)0x3f16ab,&desc_res.m_records,&num_keys,
                   &num_ckeys,(int *)local_148._M_pod_data);
        DVar16 = desc_res.m_result;
      }
      if ((int)DVar6 < (int)DVar16) {
        DVar6 = DVar16;
      }
      if (DVar6 == UNKNOWN_DESCRIPTOR) {
        DVar6 = UNKNOWN_DESCRIPTOR;
      }
      else {
        _Var1._M_head_impl =
             (this->m_batch)._M_t.
             super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
             .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
        _nMinVersion = (pointer)0x0;
        auStack_a0._0_8_ = (pointer)0x0;
        auStack_a0._16_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:974:9)>
             ::_M_invoke;
        auStack_a0._8_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:974:9)>
             ::_M_manager;
        LVar10 = LoadRecords(pwallet,_Var1._M_head_impl,(string *)DBKeys::NAME_abi_cxx11_,
                             (LoadFunc *)&nMinVersion);
        std::_Function_base::~_Function_base((_Function_base *)&nMinVersion);
        desc_res.m_result = LOAD_OK;
        desc_res.m_records = 0;
        auStack_60 = (undefined1  [8])0x0;
        p_Stack_50 = std::
                     _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:986:9)>
                     ::_M_invoke;
        local_58 = std::
                   _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:986:9)>
                   ::_M_manager;
        LVar11 = LoadRecords(pwallet,_Var1._M_head_impl,(string *)DBKeys::PURPOSE_abi_cxx11_,
                             (LoadFunc *)&desc_res);
        std::_Function_base::~_Function_base((_Function_base *)&desc_res);
        key_res.m_result = LOAD_OK;
        key_res.m_records = 0;
        LVar12 = LoadRecords(pwallet,_Var1._M_head_impl,(string *)DBKeys::DESTDATA_abi_cxx11_,
                             (LoadFunc *)&key_res);
        DVar16 = LVar11.m_result;
        if ((int)LVar11.m_result < (int)LVar10.m_result) {
          DVar16 = LVar10.m_result;
        }
        std::_Function_base::~_Function_base((_Function_base *)&key_res);
        if ((int)DVar16 <= (int)LVar12.m_result) {
          DVar16 = LVar12.m_result;
        }
        DVar15 = LOAD_OK;
        if (0 < (int)DVar16) {
          DVar15 = DVar16;
        }
        if (DVar15 <= DVar6) {
          DVar15 = DVar6;
        }
        _Var1._M_head_impl =
             (this->m_batch)._M_t.
             super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
             .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
        _nMinVersion = &any_unordered;
        any_unordered = false;
        auStack_a0._0_8_ = &upgraded_txs;
        auStack_a0._16_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1036:9)>
             ::_M_invoke;
        auStack_a0._8_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1036:9)>
             ::_M_manager;
        LVar10 = LoadRecords(pwallet,_Var1._M_head_impl,(string *)DBKeys::TX_abi_cxx11_,
                             (LoadFunc *)&nMinVersion);
        std::_Function_base::~_Function_base((_Function_base *)&nMinVersion);
        desc_res.m_result = LOAD_OK;
        desc_res.m_records = 0;
        auStack_60 = (undefined1  [8])0x0;
        p_Stack_50 = std::
                     _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1089:9)>
                     ::_M_invoke;
        local_58 = std::
                   _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1089:9)>
                   ::_M_manager;
        LVar11 = LoadRecords(pwallet,_Var1._M_head_impl,(string *)DBKeys::LOCKED_UTXO_abi_cxx11_,
                             (LoadFunc *)&desc_res);
        std::_Function_base::~_Function_base((_Function_base *)&desc_res);
        key_res.m_result = LOAD_OK;
        key_res.m_records = 0;
        LVar12 = LoadRecords(pwallet,_Var1._M_head_impl,(string *)DBKeys::ORDERPOSNEXT_abi_cxx11_,
                             (LoadFunc *)&key_res);
        DVar16 = LVar11.m_result;
        if ((int)LVar11.m_result < (int)LVar10.m_result) {
          DVar16 = LVar10.m_result;
        }
        std::_Function_base::~_Function_base((_Function_base *)&key_res);
        if ((int)DVar16 <= (int)LVar12.m_result) {
          DVar16 = LVar12.m_result;
        }
        DVar6 = LOAD_OK;
        if (0 < (int)DVar16) {
          DVar6 = DVar16;
        }
        if (DVar6 <= DVar15) {
          DVar6 = DVar15;
        }
        _Var1._M_head_impl =
             (this->m_batch)._M_t.
             super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
             .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
        p_Stack_50 = (_Invoker_type)auStack_60;
        auStack_60 = (undefined1  [8])((ulong)auStack_60 & 0xffffffff00000000);
        local_58 = (_Manager_type)0x0;
        local_40 = 0;
        local_48 = p_Stack_50;
        std::__cxx11::string::string
                  ((string *)&nMinVersion,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   DBKeys::ACTIVEEXTERNALSPK_abi_cxx11_);
        std::__cxx11::string::string
                  ((string *)&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   DBKeys::ACTIVEINTERNALSPK_abi_cxx11_);
        DVar16 = LOAD_OK;
        for (lVar14 = 0; lVar14 != 0x40; lVar14 = lVar14 + 0x20) {
          key_res = (LoadResult)&desc_res;
          LVar10 = LoadRecords(pwallet,_Var1._M_head_impl,(string *)((long)&nMinVersion + lVar14),
                               (LoadFunc *)&key_res);
          std::_Function_base::~_Function_base((_Function_base *)&key_res);
          DVar15 = LVar10.m_result;
          if ((int)LVar10.m_result < (int)DVar16) {
            DVar15 = DVar16;
          }
          DVar16 = DVar15;
        }
        lVar14 = 0x20;
        do {
          std::__cxx11::string::~string((string *)((long)&nMinVersion + lVar14));
          lVar14 = lVar14 + -0x20;
        } while (lVar14 != -0x20);
        std::
        _Rb_tree<std::pair<OutputType,_bool>,_std::pair<OutputType,_bool>,_std::_Identity<std::pair<OutputType,_bool>_>,_std::less<std::pair<OutputType,_bool>_>,_std::allocator<std::pair<OutputType,_bool>_>_>
        ::~_Rb_tree((_Rb_tree<std::pair<OutputType,_bool>,_std::pair<OutputType,_bool>,_std::_Identity<std::pair<OutputType,_bool>_>,_std::less<std::pair<OutputType,_bool>_>,_std::allocator<std::pair<OutputType,_bool>_>_>
                     *)&desc_res);
        _nMinVersion = (pointer)0x0;
        auStack_a0._0_8_ = (pointer)0x0;
        auStack_a0._16_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1151:9)>
             ::_M_invoke;
        auStack_a0._8_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1151:9)>
             ::_M_manager;
        LVar10 = LoadRecords(pwallet,(this->m_batch)._M_t.
                                     super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                                     .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>.
                                     _M_head_impl,(string *)DBKeys::MASTER_KEY_abi_cxx11_,
                             (LoadFunc *)&nMinVersion);
        if ((int)DVar6 < (int)DVar16) {
          DVar6 = DVar16;
        }
        std::_Function_base::~_Function_base((_Function_base *)&nMinVersion);
        puVar2 = upgraded_txs.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((int)DVar6 <= (int)LVar10.m_result) {
          DVar6 = LVar10.m_result;
        }
        if (DVar6 == LOAD_OK) {
          for (__k = upgraded_txs.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start; __k != puVar2; __k = __k + 1) {
            wtx = std::__detail::
                  _Map_base<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::at((_Map_base<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        *)&pwallet->mapWallet,__k);
            WriteTx(this,wtx);
          }
          if (!bVar3 || last_client != 0x46c6c) {
            DatabaseBatch::Write<std::__cxx11::string,int>
                      ((this->m_batch)._M_t.
                       super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                       .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       DBKeys::VERSION_abi_cxx11_,&CLIENT_VERSION,true);
          }
          DVar6 = LOAD_OK;
          if (any_unordered == true) {
            DVar6 = CWallet::ReorderTransactions(pwallet);
          }
          CWallet::UpgradeKeyMetadata(pwallet);
          CWallet::UpgradeDescriptorCache(pwallet);
        }
      }
      goto LAB_0019941c;
    }
    CWallet::WalletLogPrintf<>(pwallet,(ConstevalFormatString<0U>)0x3f1123);
  }
  DVar6 = TOO_NEW;
LAB_0019941c:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock6.super_unique_lock);
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
            (&upgraded_txs.super__Vector_base<uint256,_std::allocator<uint256>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return DVar6;
}

Assistant:

DBErrors WalletBatch::LoadWallet(CWallet* pwallet)
{
    DBErrors result = DBErrors::LOAD_OK;
    bool any_unordered = false;
    std::vector<uint256> upgraded_txs;

    LOCK(pwallet->cs_wallet);

    // Last client version to open this wallet
    int last_client = CLIENT_VERSION;
    bool has_last_client = m_batch->Read(DBKeys::VERSION, last_client);
    pwallet->WalletLogPrintf("Wallet file version = %d, last client version = %d\n", pwallet->GetVersion(), last_client);

    try {
        if ((result = LoadMinVersion(pwallet, *m_batch)) != DBErrors::LOAD_OK) return result;

        // Load wallet flags, so they are known when processing other records.
        // The FLAGS key is absent during wallet creation.
        if ((result = LoadWalletFlags(pwallet, *m_batch)) != DBErrors::LOAD_OK) return result;

#ifndef ENABLE_EXTERNAL_SIGNER
        if (pwallet->IsWalletFlagSet(WALLET_FLAG_EXTERNAL_SIGNER)) {
            pwallet->WalletLogPrintf("Error: External signer wallet being loaded without external signer support compiled\n");
            return DBErrors::EXTERNAL_SIGNER_SUPPORT_REQUIRED;
        }
#endif

        // Load legacy wallet keys
        result = std::max(LoadLegacyWalletRecords(pwallet, *m_batch, last_client), result);

        // Load descriptors
        result = std::max(LoadDescriptorWalletRecords(pwallet, *m_batch, last_client), result);
        // Early return if there are unknown descriptors. Later loading of ACTIVEINTERNALSPK and ACTIVEEXTERNALEXPK
        // may reference the unknown descriptor's ID which can result in a misleading corruption error
        // when in reality the wallet is simply too new.
        if (result == DBErrors::UNKNOWN_DESCRIPTOR) return result;

        // Load address book
        result = std::max(LoadAddressBookRecords(pwallet, *m_batch), result);

        // Load tx records
        result = std::max(LoadTxRecords(pwallet, *m_batch, upgraded_txs, any_unordered), result);

        // Load SPKMs
        result = std::max(LoadActiveSPKMs(pwallet, *m_batch), result);

        // Load decryption keys
        result = std::max(LoadDecryptionKeys(pwallet, *m_batch), result);
    } catch (...) {
        // Exceptions that can be ignored or treated as non-critical are handled by the individual loading functions.
        // Any uncaught exceptions will be caught here and treated as critical.
        result = DBErrors::CORRUPT;
    }

    // Any wallet corruption at all: skip any rewriting or
    // upgrading, we don't want to make it worse.
    if (result != DBErrors::LOAD_OK)
        return result;

    for (const uint256& hash : upgraded_txs)
        WriteTx(pwallet->mapWallet.at(hash));

    if (!has_last_client || last_client != CLIENT_VERSION) // Update
        m_batch->Write(DBKeys::VERSION, CLIENT_VERSION);

    if (any_unordered)
        result = pwallet->ReorderTransactions();

    // Upgrade all of the wallet keymetadata to have the hd master key id
    // This operation is not atomic, but if it fails, updated entries are still backwards compatible with older software
    try {
        pwallet->UpgradeKeyMetadata();
    } catch (...) {
        result = DBErrors::CORRUPT;
    }

    // Upgrade all of the descriptor caches to cache the last hardened xpub
    // This operation is not atomic, but if it fails, only new entries are added so it is backwards compatible
    try {
        pwallet->UpgradeDescriptorCache();
    } catch (...) {
        result = DBErrors::CORRUPT;
    }

    return result;
}